

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O2

void __thiscall
qclab::qgates::iSWAP<std::complex<float>_>::apply
          (iSWAP<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_16_2_357f297d f;
  _Vector_base<int,_std::allocator<int>_> local_50;
  anon_class_16_2_357f297d local_38;
  
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[5])
            (&local_50,this);
  iVar1 = *local_50._M_impl.super__Vector_impl_data._M_start;
  *local_50._M_impl.super__Vector_impl_data._M_start = iVar1 + offset;
  iVar2 = local_50._M_impl.super__Vector_impl_data._M_start[1];
  local_50._M_impl.super__Vector_impl_data._M_start[1] = offset + iVar2;
  local_38.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  if (op == ConjTrans) {
    local_38.lambda._M_value = 0xbf80000000000000;
  }
  else {
    local_38.lambda._M_value = 0x3f80000000000000;
  }
  apply4bc<qclab::qgates::lambda_iSWAP<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,offset + iVar2,&local_38);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void iSWAP< T >::apply( Op op , const int nbQubits ,
                          std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_iSWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }